

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compositecodec.h
# Opt level: O0

void __thiscall
FastPForLib::
CompositeCodec<FastPForLib::SIMDOPTPFor<4U,_FastPForLib::Simple16<false>_>,_FastPForLib::VariableByte>
::~CompositeCodec(CompositeCodec<FastPForLib::SIMDOPTPFor<4U,_FastPForLib::Simple16<false>_>,_FastPForLib::VariableByte>
                  *this)

{
  IntegerCODEC *in_RDI;
  
  in_RDI->_vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_00481480;
  VariableByte::~VariableByte((VariableByte *)0x15fc8a);
  SIMDOPTPFor<4U,_FastPForLib::Simple16<false>_>::~SIMDOPTPFor
            ((SIMDOPTPFor<4U,_FastPForLib::Simple16<false>_> *)0x15fc98);
  IntegerCODEC::~IntegerCODEC(in_RDI);
  return;
}

Assistant:

CompositeCodec() : codec1(), codec2() {}